

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_value.cpp
# Opt level: O3

value_ptr __thiscall pstore::dump::make_value(dump *this,digest *d)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  value_ptr vVar2;
  string str;
  undefined1 local_51;
  string *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  
  local_38 = 0;
  local_30 = 0;
  local_40 = &local_30;
  uint128::to_hex<std::back_insert_iterator<std::__cxx11::string>>
            (d,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40);
  local_50 = (string *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pstore::dump::string,std::allocator<pstore::dump::string>,std::__cxx11::string_const&>
            (&local_48,&local_50,(allocator<pstore::dump::string> *)&local_51,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40);
  *(string **)this = local_50;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = local_48._M_pi;
  _Var1._M_pi = extraout_RDX;
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_48._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0012106c;
    }
    else {
      (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
LAB_0012106c:
  if (local_40 != &local_30) {
    operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
    _Var1._M_pi = extraout_RDX_01;
  }
  vVar2.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  vVar2.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (value_ptr)vVar2.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_ptr make_value (index::digest const & d) {
            std::string str;
            d.to_hex (std::back_inserter (str));
            return make_value (str);
        }